

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int nni_msg_header_trim(nni_msg *m,size_t len)

{
  size_t len_local;
  nni_msg *m_local;
  
  if (m->m_header_len < len) {
    m_local._4_4_ = 3;
  }
  else {
    memmove(m,(void *)((long)m->m_header_buf + len),m->m_header_len - len);
    m->m_header_len = m->m_header_len - len;
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

int
nni_msg_header_trim(nni_msg *m, size_t len)
{
	if (len > m->m_header_len) {
		return (NNG_EINVAL);
	}
	memmove(m->m_header_buf, ((uint8_t *) m->m_header_buf) + len,
	    m->m_header_len - len);
	m->m_header_len -= len;
	return (0);
}